

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::FillWheatsheafItems
          (aggreports *this,outkey2 key,
          map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *items,OASIS_FLOAT loss,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *maxPeriodNo,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *unusedperiodstoweighting)

{
  int iVar1;
  iterator iVar2;
  mapped_type_conflict1 *pmVar3;
  mapped_type *this_00;
  wheatkey wk;
  lossval lv;
  key_type local_60;
  undefined8 local_58;
  int local_50;
  value_type local_48;
  
  local_60.sidx = key.sidx;
  local_58 = key._0_8_;
  local_60.summary_id = key.summary_id;
  local_50 = local_60.sidx;
  local_48.value = loss;
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::find(&(this->periodstoweighting_)._M_t,(key_type *)((long)&local_58 + 4));
  if ((_Rb_tree_header *)iVar2._M_node !=
      &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header) {
    local_48.period_weighting = (double)iVar2._M_node[1]._M_parent;
    iVar1 = local_58._4_4_;
    local_48.period_no = local_58._4_4_;
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](maxPeriodNo,(key_type *)&local_58);
    if (*pmVar3 < iVar1) {
      pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](maxPeriodNo,(key_type *)&local_58);
      *pmVar3 = iVar1;
    }
    this_00 = std::
              map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
              ::operator[](items,&local_60);
    std::vector<lossval,_std::allocator<lossval>_>::push_back(this_00,&local_48);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::erase(&unusedperiodstoweighting->_M_t,(key_type *)((long)&local_58 + 4));
  return;
}

Assistant:

inline void aggreports::FillWheatsheafItems(const outkey2 key,
	std::map<wheatkey, lossvec2> &items, const OASIS_FLOAT loss,
	std::map<int, int> &maxPeriodNo,
	std::map<int, double> &unusedperiodstoweighting) {

  wheatkey wk;
  wk.sidx = key.sidx;
  wk.summary_id = key.summary_id;
  lossval lv;
  lv.value = loss;
  auto iter = periodstoweighting_.find(key.period_no);
  if (iter != periodstoweighting_.end()) {
    lv.period_weighting = iter->second;
    lv.period_no = key.period_no;
    if (lv.period_no > maxPeriodNo[key.summary_id]) {
	maxPeriodNo[key.summary_id] = lv.period_no;
    }
    items[wk].push_back(lv);
  }
  unusedperiodstoweighting.erase(key.period_no);

}